

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::ValidateProto3Field
          (DescriptorBuilder *this,FieldDescriptor *field,FieldDescriptorProto *proto)

{
  key_type *__k;
  int iVar1;
  iterator iVar2;
  long lVar3;
  long *plVar4;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *arg;
  long *plVar5;
  FieldDescriptor *pFVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  once_flag *__once;
  string *element_name;
  FieldDescriptor *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  string local_98;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  FieldDescriptor *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (field[0x42] == (FieldDescriptor)0x1) {
    __k = *(key_type **)(*(long *)(field + 0x50) + 8);
    if (((anonymous_namespace)::AllowedExtendeeInProto3(std::__cxx11::string_const&)::
         allowed_proto3_extendees_abi_cxx11_ == '\0') &&
       (iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::
                                     AllowedExtendeeInProto3(std::__cxx11::string_const&)::
                                     allowed_proto3_extendees_abi_cxx11_), iVar1 != 0)) {
      arg = &(anonymous_namespace)::NewAllowedProto3Extendee_abi_cxx11_()->_M_t;
      internal::OnShutdownRun
                (internal::
                 OnShutdownDelete<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::anon_class_1_0_00000001::__invoke,arg);
      (anonymous_namespace)::AllowedExtendeeInProto3(std::__cxx11::string_const&)::
      allowed_proto3_extendees_abi_cxx11_ = arg;
      __cxa_guard_release(&(anonymous_namespace)::
                           AllowedExtendeeInProto3(std::__cxx11::string_const&)::
                           allowed_proto3_extendees_abi_cxx11_);
    }
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find((anonymous_namespace)::AllowedExtendeeInProto3(std::__cxx11::string_const&)::
                   allowed_proto3_extendees_abi_cxx11_,__k);
    if ((_Rb_tree_header *)iVar2._M_node ==
        &((anonymous_namespace)::AllowedExtendeeInProto3(std::__cxx11::string_const&)::
          allowed_proto3_extendees_abi_cxx11_->_M_impl).super__Rb_tree_header) {
      AddError(this,*(string **)(field + 8),&proto->super_Message,EXTENDEE,
               "Extensions in proto3 are only allowed for defining options.");
    }
  }
  if (*(int *)(field + 0x3c) == 2) {
    AddError(this,*(string **)(field + 8),&proto->super_Message,TYPE,
             "Required fields are not allowed in proto3.");
  }
  if (field[0x40] == (FieldDescriptor)0x1) {
    AddError(this,*(string **)(field + 8),&proto->super_Message,DEFAULT_VALUE,
             "Explicit default values are not allowed in proto3.");
  }
  if (*(once_flag **)(field + 0x30) == (once_flag *)0x0) {
    iVar1 = *(int *)(field + 0x38);
    if (iVar1 != 0xe) goto LAB_002df188;
LAB_002def72:
    __once = (once_flag *)0x0;
LAB_002def74:
    lVar3 = *(long *)(field + 0x70);
    if (lVar3 == 0) goto LAB_002df166;
    if (__once != (once_flag *)0x0) {
      local_98._M_dataplus._M_p = (pointer)field;
      std::
      call_once<void(&)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (__once,FieldDescriptor::TypeOnceInit,(FieldDescriptor **)&local_98);
      __once = *(once_flag **)(field + 0x30);
      lVar3 = *(long *)(field + 0x70);
      if (*(int *)(*(long *)(lVar3 + 0x10) + 0x3c) != 3) {
        element_name = *(string **)(field + 8);
        if (__once != (once_flag *)0x0) {
          local_58 = field;
          std::
          call_once<void(&)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (__once,FieldDescriptor::TypeOnceInit,&local_58);
          lVar3 = *(long *)(field + 0x70);
        }
        goto LAB_002defe5;
      }
      goto LAB_002df166;
    }
    if (*(int *)(*(long *)(lVar3 + 0x10) + 0x3c) != 3) {
      element_name = *(string **)(field + 8);
LAB_002defe5:
      std::operator+(&local_50,"Enum type \"",
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      (lVar3 + 8));
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_78 = &local_68;
      plVar5 = plVar4 + 2;
      if ((long *)*plVar4 == plVar5) {
        local_68 = *plVar5;
        lStack_60 = plVar4[3];
      }
      else {
        local_68 = *plVar5;
        local_78 = (long *)*plVar4;
      }
      local_70 = plVar4[1];
      *plVar4 = (long)plVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_78,**(ulong **)(*(long *)(field + 0x50) + 8));
      local_b8 = (FieldDescriptor *)&local_a8;
      pFVar6 = (FieldDescriptor *)(plVar4 + 2);
      if ((FieldDescriptor *)*plVar4 == pFVar6) {
        local_a8 = *(long *)pFVar6;
        lStack_a0 = plVar4[3];
      }
      else {
        local_a8 = *(long *)pFVar6;
        local_b8 = (FieldDescriptor *)*plVar4;
      }
      local_b0 = plVar4[1];
      *plVar4 = (long)pFVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_b8);
      paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 == paVar7) {
        local_98.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
        local_98.field_2._8_8_ = plVar4[3];
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      }
      else {
        local_98.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
        local_98._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_98._M_string_length = plVar4[1];
      *plVar4 = (long)paVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      AddError(this,element_name,&proto->super_Message,TYPE,&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      if (local_b8 != (FieldDescriptor *)&local_a8) {
        operator_delete(local_b8);
      }
      if (local_78 != &local_68) {
        operator_delete(local_78);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      __once = *(once_flag **)(field + 0x30);
      goto LAB_002df166;
    }
  }
  else {
    local_98._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
    local_b8 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_98,&local_b8)
    ;
    __once = *(once_flag **)(field + 0x30);
    if (*(int *)(field + 0x38) == 0xe) {
      if (__once == (once_flag *)0x0) goto LAB_002def72;
      local_98._M_dataplus._M_p = (pointer)field;
      std::
      call_once<void(&)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (__once,FieldDescriptor::TypeOnceInit,(FieldDescriptor **)&local_98);
      __once = *(once_flag **)(field + 0x30);
      goto LAB_002def74;
    }
LAB_002df166:
    if (__once != (once_flag *)0x0) {
      local_98._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
      local_b8 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (__once,(_func_void_FieldDescriptor_ptr **)&local_98,&local_b8);
    }
  }
  iVar1 = *(int *)(field + 0x38);
LAB_002df188:
  if (iVar1 == 10) {
    AddError(this,*(string **)(field + 8),&proto->super_Message,TYPE,
             "Groups are not supported in proto3 syntax.");
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateProto3Field(FieldDescriptor* field,
                                            const FieldDescriptorProto& proto) {
  if (field->is_extension() &&
      !AllowedExtendeeInProto3(field->containing_type()->full_name())) {
    AddError(field->full_name(), proto,
             DescriptorPool::ErrorCollector::EXTENDEE,
             "Extensions in proto3 are only allowed for defining options.");
  }
  if (field->is_required()) {
    AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
             "Required fields are not allowed in proto3.");
  }
  if (field->has_default_value()) {
    AddError(field->full_name(), proto,
             DescriptorPool::ErrorCollector::DEFAULT_VALUE,
             "Explicit default values are not allowed in proto3.");
  }
  if (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM &&
      field->enum_type() &&
      field->enum_type()->file()->syntax() != FileDescriptor::SYNTAX_PROTO3) {
    // Proto3 messages can only use Proto3 enum types; otherwise we can't
    // guarantee that the default value is zero.
    AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
             "Enum type \"" + field->enum_type()->full_name() +
                 "\" is not a proto3 enum, but is used in \"" +
                 field->containing_type()->full_name() +
                 "\" which is a proto3 message type.");
  }
  if (field->type() == FieldDescriptor::TYPE_GROUP) {
    AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
             "Groups are not supported in proto3 syntax.");
  }
}